

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopCheck.c
# Opt level: O2

int Hop_ManCheck(Hop_Man_t *p)

{
  Hop_Obj_t *pGhost;
  ulong uVar1;
  Hop_Obj_t *pHVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  
  iVar4 = 0;
  do {
    if (p->vPis->nSize <= iVar4) {
      iVar4 = 0;
      goto LAB_00650069;
    }
    pGhost = (Hop_Obj_t *)Vec_PtrEntry(p->vPis,iVar4);
  } while ((pGhost->pFanin0 < (Hop_Obj_t *)0x2) &&
          (iVar4 = iVar4 + 1, pGhost->pFanin1 < (Hop_Obj_t *)0x2));
  pcVar5 = "Hop_ManCheck: The PI node \"%p\" has fanins.\n";
  goto LAB_00650053;
LAB_00650095:
  if (p->nTableSize <= lVar6) {
    if (p->nCreated - p->nDeleted == p->nObjs[5] + p->nObjs[3] + p->nObjs[4] + p->nObjs[2] + 1) {
      iVar4 = Hop_TableCountEntries(p);
      if (iVar4 == p->nObjs[5] + p->nObjs[4]) {
        return 1;
      }
      pcVar5 = "Hop_ManCheck: The number of nodes in the structural hashing table is wrong.";
    }
    else {
      pcVar5 = "Hop_ManCheck: The number of created nodes is wrong.";
    }
    puts(pcVar5);
    return 0;
  }
  pGhost = p->pTable[lVar6];
  if (pGhost != (Hop_Obj_t *)0x0) {
    uVar1 = (ulong)pGhost->pFanin0 & 0xfffffffffffffffe;
    if ((uVar1 == 0) || (uVar3 = (ulong)pGhost->pFanin1 & 0xfffffffffffffffe, uVar3 == 0)) {
      pcVar5 = "Hop_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n";
      goto LAB_00650053;
    }
    if (*(int *)(uVar3 + 0x24) <= *(int *)(uVar1 + 0x24)) {
      pcVar5 = "Hop_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n";
      goto LAB_00650053;
    }
    pHVar2 = Hop_TableLookup(p,pGhost);
    if (pHVar2 != pGhost) {
      pcVar5 = "Hop_ManCheck: Node \"%p\" is not in the structural hashing table.\n";
      goto LAB_00650053;
    }
  }
  lVar6 = lVar6 + 1;
  goto LAB_00650095;
  while (iVar4 = iVar4 + 1, pGhost->pFanin1 < (Hop_Obj_t *)0x2) {
LAB_00650069:
    if (p->vPos->nSize <= iVar4) {
      lVar6 = 0;
      goto LAB_00650095;
    }
    pGhost = (Hop_Obj_t *)Vec_PtrEntry(p->vPos,iVar4);
    if (pGhost->pFanin0 < (Hop_Obj_t *)0x2) {
      pcVar5 = "Hop_ManCheck: The PO node \"%p\" has NULL fanin.\n";
      goto LAB_00650053;
    }
  }
  pcVar5 = "Hop_ManCheck: The PO node \"%p\" has second fanin.\n";
LAB_00650053:
  printf(pcVar5,pGhost);
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Hop_ManCheck( Hop_Man_t * p )
{
    Hop_Obj_t * pObj, * pObj2;
    int i;
    // check primary inputs
    Hop_ManForEachPi( p, pObj, i )
    {
        if ( Hop_ObjFanin0(pObj) || Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The PI node \"%p\" has fanins.\n", pObj );
            return 0;
        }
    }
    // check primary outputs
    Hop_ManForEachPo( p, pObj, i )
    {
        if ( !Hop_ObjFanin0(pObj) )
        {
            printf( "Hop_ManCheck: The PO node \"%p\" has NULL fanin.\n", pObj );
            return 0;
        }
        if ( Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The PO node \"%p\" has second fanin.\n", pObj );
            return 0;
        }
    }
    // check internal nodes
    Hop_ManForEachNode( p, pObj, i )
    {
        if ( !Hop_ObjFanin0(pObj) || !Hop_ObjFanin1(pObj) )
        {
            printf( "Hop_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n", pObj );
            return 0;
        }
        if ( Hop_ObjFanin0(pObj)->Id >= Hop_ObjFanin1(pObj)->Id )
        {
            printf( "Hop_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n", pObj );
            return 0;
        }
        pObj2 = Hop_TableLookup( p, pObj );
        if ( pObj2 != pObj )
        {
            printf( "Hop_ManCheck: Node \"%p\" is not in the structural hashing table.\n", pObj );
            return 0;
        }
    }
    // count the total number of nodes
    if ( Hop_ManObjNum(p) != 1 + Hop_ManPiNum(p) + Hop_ManPoNum(p) + Hop_ManAndNum(p) + Hop_ManExorNum(p) )
    {
        printf( "Hop_ManCheck: The number of created nodes is wrong.\n" );
        return 0;
    }
    // count the number of nodes in the table
    if ( Hop_TableCountEntries(p) != Hop_ManAndNum(p) + Hop_ManExorNum(p) )
    {
        printf( "Hop_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
//    if ( !Hop_ManIsAcyclic(p) )
//        return 0;
    return 1; 
}